

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::generateArguments
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,
          ExpressionList *operands,Literals *arguments)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  Expression **ppEVar2;
  Literal *x;
  undefined1 local_40 [8];
  Iterator __begin2;
  
  SmallVector<wasm::Literal,_1UL>::reserve
            (&arguments->super_SmallVector<wasm::Literal,_1UL>,*(size_t *)(operands + 8));
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  pAVar1 = *(ArenaVector<wasm::Expression_*> **)(operands + 8);
  local_40 = (undefined1  [8])operands;
  while ((__begin2.parent != pAVar1 || (local_40 != (undefined1  [8])operands))) {
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)local_40);
    visit(__return_storage_ptr__,this,*ppEVar2);
    if ((__return_storage_ptr__->breakTo).super_IString.str._M_str != (char *)0x0) {
      return __return_storage_ptr__;
    }
    x = Flow::getSingleValue(__return_storage_ptr__);
    SmallVector<wasm::Literal,_1UL>::push_back(&arguments->super_SmallVector<wasm::Literal,_1UL>,x);
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)__return_storage_ptr__);
    __begin2.parent = __begin2.parent + 1;
  }
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                    _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id =
       0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.
  i64 = 0;
  (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Flow generateArguments(const ExpressionList& operands, Literals& arguments) {
    NOTE_ENTER_("generateArguments");
    arguments.reserve(operands.size());
    for (auto expression : operands) {
      Flow flow = self()->visit(expression);
      if (flow.breaking()) {
        return flow;
      }
      NOTE_EVAL1(flow.values);
      arguments.push_back(flow.getSingleValue());
    }
    return Flow();
  }